

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall
CCNR::ls_solver::initialize(ls_solver *this,vector<char,_std::allocator<char>_> *init_solution)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  ostream *this_00;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference plVar9;
  ls_solver *in_RSI;
  Mersenne *in_RDI;
  ls_solver *unaff_retaddr;
  lit l;
  iterator __end2;
  iterator __begin2;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  size_t c;
  size_t v;
  int in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  value_type in_stack_ffffffffffffffad;
  value_type in_stack_ffffffffffffffae;
  value_type in_stack_ffffffffffffffaf;
  uint local_48;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_30;
  reference local_28;
  ulong local_20;
  ulong uVar10;
  
  clear_prev_data((ls_solver *)__range2);
  if (in_RSI == (ls_solver *)0x0) {
    for (uVar10 = 1; uVar10 <= *(ulong *)(in_RDI->mt + 0x14); uVar10 = uVar10 + 1) {
      iVar3 = Mersenne::next(in_RDI,CONCAT13(in_stack_ffffffffffffffaf,
                                             CONCAT12(in_stack_ffffffffffffffae,
                                                      CONCAT11(in_stack_ffffffffffffffad,
                                                               in_stack_ffffffffffffffac))));
      in_stack_ffffffffffffffaf = iVar3 != 0;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI->mt + 0x38),uVar10);
      *pvVar4 = in_stack_ffffffffffffffaf;
    }
  }
  else {
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)in_RSI);
    if (sVar5 != *(size_type *)(in_RDI->mt + 0x14)) {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "c Error: the init solution\'s size is not equal to the number of variables."
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    for (uVar10 = 1; uVar10 <= *(ulong *)(in_RDI->mt + 0x14); uVar10 = uVar10 + 1) {
      pvVar6 = std::vector<char,_std::allocator<char>_>::at
                         ((vector<char,_std::allocator<char>_> *)in_RDI,
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT15(in_stack_ffffffffffffffad,
                                                     CONCAT14(in_stack_ffffffffffffffac,
                                                              in_stack_ffffffffffffffa8)))));
      in_stack_ffffffffffffffad = *pvVar6;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI->mt + 0x38),uVar10);
      *pvVar4 = in_stack_ffffffffffffffad;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI->mt + 0x38),uVar10);
      in_stack_ffffffffffffffae = *pvVar4;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI->mt + 0x3e),uVar10);
      *pvVar4 = in_stack_ffffffffffffffae;
    }
  }
  for (uVar10 = 1; uVar10 <= *(ulong *)(in_RDI->mt + 0x14); uVar10 = uVar10 + 1) {
    pvVar7 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI->mt + 8),
                        uVar10);
    pvVar7->unsat_appear = 0;
  }
  for (local_20 = 0; local_20 < *(ulong *)(in_RDI->mt + 0x16); local_20 = local_20 + 1) {
    pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                       ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI->mt + 0xe),
                        local_20);
    pvVar8->sat_count = 0;
    pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                       ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI->mt + 0xe),
                        local_20);
    pvVar8->sat_var = -1;
    pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                       ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI->mt + 0xe),
                        local_20);
    pvVar8->weight = 1;
    local_28 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                         ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI->mt + 0xe),
                          local_20);
    local_30._M_current =
         (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                          ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT15(in_stack_ffffffffffffffad,
                                                      CONCAT14(in_stack_ffffffffffffffac,
                                                               in_stack_ffffffffffffffa8)))));
    std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
              ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
               CONCAT17(in_stack_ffffffffffffffaf,
                        CONCAT16(in_stack_ffffffffffffffae,
                                 CONCAT15(in_stack_ffffffffffffffad,
                                          CONCAT14(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8)))));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                               *)in_RDI,
                              (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(in_stack_ffffffffffffffad,
                                                            CONCAT14(in_stack_ffffffffffffffac,
                                                                     in_stack_ffffffffffffffa8))))),
          bVar2) {
      plVar9 = __gnu_cxx::
               __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
               operator*(&local_30);
      uVar1 = *(undefined8 *)plVar9;
      sVar5 = plVar9->var_num;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI->mt + 0x38),sVar5);
      local_48 = (uint)uVar1;
      if ((int)*pvVar4 == (local_48 & 1)) {
        pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)
                            (in_RDI->mt + 0xe),local_20);
        pvVar8->sat_count = pvVar8->sat_count + 1;
        in_stack_ffffffffffffffa8 = (int)sVar5;
        pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)
                            (in_RDI->mt + 0xe),local_20);
        pvVar8->sat_var = in_stack_ffffffffffffffa8;
      }
      __gnu_cxx::__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
      ::operator++(&local_30);
    }
    pvVar8 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                       ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI->mt + 0xe),
                        local_20);
    if (pvVar8->sat_count == 0) {
      unsat_a_clause(in_RSI,(int)(uVar10 >> 0x20));
    }
  }
  in_RDI[1].mt[0x57] = 1;
  in_RDI[1].mt[0x59] = 0;
  in_RDI[1].mt[0x5a] = 0;
  initialize_variable_datas(unaff_retaddr);
  return;
}

Assistant:

void ls_solver::initialize(const vector<char> *init_solution)
{
    size_t v, c;
    clear_prev_data();
    if (!init_solution) {
        // default random generation
        // cout<<"c using random initial solution"<<endl;
        for (v = 1; v <= _num_vars; v++) {
            _solution[v] = (_random_gen.next(2) == 0 ? 0 : 1);
        }
    } else {
        // cout<<"ok\n";
        if (init_solution->size() != _num_vars) {
            cout << "c Error: the init solution's size is not equal to the number of variables." << endl;
            exit(0);
        }
        for (v = 1; v <= _num_vars; v++) {
            _solution[v] = init_solution->at(v - 1);
            _best_solution[v] = _solution[v];
        }
        // cout<<"ok1\n";
    }
    // unsat_appears, will be updated when calling unsat_a_clause function.
    for (v = 1; v <= _num_vars; v++) {
        _vars[v].unsat_appear = 0;
    }
    // initialize data structure of clauses according to init solution
    for (c = 0; c < _num_clauses; c++) {
        _clauses[c].sat_count = 0;
        _clauses[c].sat_var = -1;
        _clauses[c].weight = 1;

        for (lit l : _clauses[c].literals) {
            if (_solution[l.var_num] == l.sense) {
                _clauses[c].sat_count++;
                _clauses[c].sat_var = l.var_num;
            }
        }
        if (0 == _clauses[c].sat_count) {
            unsat_a_clause(c);
        }
    }
    _avg_clause_weight = 1;
    _delta_total_clause_weight = 0;
    initialize_variable_datas();
}